

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Browser.cxx
# Opt level: O3

FL_BLINE * __thiscall Fl_Browser::find_line(Fl_Browser *this,int line)

{
  int iVar1;
  FL_BLINE *pFVar2;
  int iVar3;
  long lVar4;
  
  iVar3 = this->cacheline;
  if (iVar3 == line) {
    return this->cache;
  }
  iVar1 = this->lines;
  if (((iVar3 == 0) || (line <= iVar3 / 2)) || (lVar4 = 0x278, (iVar1 + iVar3) / 2 <= line)) {
    lVar4 = (ulong)(iVar1 / 2 < line) * 8 + 0x268;
    iVar3 = 1;
    if (iVar1 / 2 < line) {
      iVar3 = iVar1;
    }
  }
  pFVar2 = *(FL_BLINE **)
            ((long)&(this->super_Fl_Browser_).super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget + lVar4
            );
  if (pFVar2 != (FL_BLINE *)0x0 && iVar3 < line) {
    do {
      iVar3 = iVar3 + 1;
      pFVar2 = pFVar2->next;
      if (line <= iVar3) break;
    } while (pFVar2 != (FL_BLINE *)0x0);
  }
  for (; (line < iVar3 && (pFVar2 != (FL_BLINE *)0x0)); pFVar2 = pFVar2->prev) {
    iVar3 = iVar3 + -1;
  }
  this->cacheline = line;
  this->cache = pFVar2;
  return pFVar2;
}

Assistant:

FL_BLINE* Fl_Browser::find_line(int line) const {
  int n; FL_BLINE* l;
  if (line == cacheline) return cache;
  if (cacheline && line > (cacheline/2) && line < ((cacheline+lines)/2)) {
    n = cacheline; l = cache;
  } else if (line <= (lines/2)) {
    n = 1; l = first;
  } else {
    n = lines; l = last;
  }
  for (; n < line && l; n++) l = l->next;
  for (; n > line && l; n--) l = l->prev;
  ((Fl_Browser*)this)->cacheline = line;
  ((Fl_Browser*)this)->cache = l;
  return l;
}